

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O2

vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> * __thiscall
LargeGapGrayCode::getBinaryCode
          (vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> *__return_storage_ptr__,
          LargeGapGrayCode *this,int bitWidth)

{
  int i;
  long lVar1;
  double dVar2;
  bitset<20UL> local_50;
  bitset<20UL> bs;
  vector<int,_std::allocator<int>_> ts;
  
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getTransitionSequence((vector<int,_std::allocator<int>_> *)&bs,this,bitWidth);
  local_50.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  lVar1 = 0;
  while( true ) {
    dVar2 = ldexp(1.0,bitWidth);
    if (dVar2 <= (double)(int)lVar1) break;
    std::vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>::push_back
              (__return_storage_ptr__,&local_50);
    std::bitset<20UL>::flip
              (&local_50,(long)*(int *)((long)bs.super__Base_bitset<1UL>._M_w + lVar1 * 4));
    lVar1 = lVar1 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&bs);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::bitset<20> > LargeGapGrayCode::getBinaryCode(int bitWidth)
{
	std::vector<std::bitset<20> > binaryCode;

	std::vector<int> ts = getTransitionSequence(bitWidth);
	std::bitset<20> bs(0);

	for(int i = 0; i < pow(2, bitWidth); i++)
	{
		binaryCode.push_back(bs);
		bs.flip(ts[i]);
	}

	return binaryCode;
}